

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

void Sbd_NtkPerformOne(Sbd_Man_t *p,int Pivot)

{
  int iVar1;
  int local_25c;
  int local_258;
  int i;
  int nStrs;
  int RetValue;
  word Truth;
  Sbd_Str_t Strs [10];
  int Pivot_local;
  Sbd_Man_t *p_local;
  
  _nStrs = 0;
  local_258 = 0;
  Strs[9].Res._4_4_ = Pivot;
  if (((p->pSto != (Sbd_Sto_t *)0x0) || (iVar1 = Sbd_ManMergeCuts(p,Pivot), iVar1 == 0)) &&
     (iVar1 = Sbd_ManWindow(p,Strs[9].Res._4_4_), iVar1 != 0)) {
    p->nTried = p->nTried + 1;
    p->nUsed = p->nUsed + 1;
    i = Sbd_ManCheckConst(p,Strs[9].Res._4_4_);
    if (i < 0) {
      if (((p->pPars->fFindDivs == 0) || (p->pPars->nLutNum < 1)) ||
         (iVar1 = Sbd_ManExplore2(p,Strs[9].Res._4_4_,(word *)&nStrs), iVar1 == 0)) {
        if ((p->pPars->nLutNum < 2) ||
           (iVar1 = Sbd_ManExplore3(p,Strs[9].Res._4_4_,&local_258,(Sbd_Str_t *)&Truth), iVar1 == 0)
           ) {
          p->nUsed = p->nUsed + -1;
        }
        else {
          Sbd_ManImplement2(p,Strs[9].Res._4_4_,local_258,(Sbd_Str_t *)&Truth);
        }
      }
      else {
        Truth._0_4_ = 1;
        Truth._4_4_ = Vec_IntSize(p->vDivSet);
        for (local_25c = 0; local_25c < Truth._4_4_; local_25c = local_25c + 1) {
          Strs[0].VarIns[(long)local_25c + -2] = local_25c;
        }
        Strs[0].VarIns[8] = nStrs;
        Strs[0].VarIns[9] = RetValue;
        Sbd_ManImplement2(p,Strs[9].Res._4_4_,1,(Sbd_Str_t *)&Truth);
      }
    }
    else {
      Vec_IntWriteEntry(p->vMirrors,Strs[9].Res._4_4_,i);
    }
  }
  return;
}

Assistant:

void Sbd_NtkPerformOne( Sbd_Man_t * p, int Pivot )
{
    Sbd_Str_t Strs[SBD_DIV_MAX]; word Truth = 0;
    int RetValue, nStrs = 0;
    if ( !p->pSto && Sbd_ManMergeCuts( p, Pivot ) )
        return;
    if ( !Sbd_ManWindow( p, Pivot ) )
        return;
    //if ( Vec_IntSize(p->vWinObjs) > 100 )
    //    printf( "Obj %d : Win = %d   TFO = %d.  Roots = %d.\n", Pivot, Vec_IntSize(p->vWinObjs), Vec_IntSize(p->vTfo), Vec_IntSize(p->vRoots) );
    p->nTried++;
    p->nUsed++;
    RetValue = Sbd_ManCheckConst( p, Pivot );
    if ( RetValue >= 0 )
    {
        Vec_IntWriteEntry( p->vMirrors, Pivot, RetValue );
        //if ( p->pPars->fVerbose ) printf( "Node %5d:  Detected constant %d.\n", Pivot, RetValue );
    }
    else if ( p->pPars->fFindDivs && p->pPars->nLutNum >= 1 && Sbd_ManExplore2( p, Pivot, &Truth ) )
    {
        int i;
        Strs->fLut = 1;
        Strs->nVarIns = Vec_IntSize( p->vDivSet );
        for ( i = 0; i < Strs->nVarIns; i++ )
            Strs->VarIns[i] = i;
        Strs->Res = Truth;
        Sbd_ManImplement2( p, Pivot, 1, Strs );
        //if ( p->pPars->fVerbose ) printf( "Node %5d:  Detected LUT%d\n", Pivot, p->pPars->nLutSize );
    }
    else if ( p->pPars->nLutNum >= 2 && Sbd_ManExplore3( p, Pivot, &nStrs, Strs ) )
    {
        Sbd_ManImplement2( p, Pivot, nStrs, Strs );
        if ( !p->pPars->fVerbose ) 
            return;
        //if ( Vec_IntSize(p->vDivSet) <= 4 )
        //    printf( "Node %5d:  Detected %d\n", Pivot, p->pPars->nLutSize );
        //else if ( Vec_IntSize(p->vDivSet) <= 6 || (Vec_IntSize(p->vDivSet) == 7 && nStrs == 2) )
        //    printf( "Node %5d:  Detected %d%d\n", Pivot, p->pPars->nLutSize, p->pPars->nLutSize );
        //else 
        //    printf( "Node %5d:  Detected %d%d%d\n", Pivot, p->pPars->nLutSize, p->pPars->nLutSize, p->pPars->nLutSize );
    }
    else
        p->nUsed--;
}